

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall PointerType::PointerType(PointerType *this,PointerType *other)

{
  long in_RSI;
  Type *in_RDI;
  
  Type::Type(in_RDI,TK_PointerType);
  in_RDI->_vptr_Type = (_func_int **)&PTR__PointerType_003008b8;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)&in_RDI[4].kind);
  in_RDI[1]._vptr_Type = *(_func_int ***)(in_RSI + 0x10);
  in_RDI[1].isConst = (bool)(*(byte *)(in_RSI + 0x1c) & 1);
  in_RDI[1].kind = *(TypeKind *)(in_RSI + 0x18);
  std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)(in_RSI + 0x20));
  return;
}

Assistant:

PointerType::PointerType(const PointerType &other): Type(TK_PointerType) {
    type = other.type;
    isArrayPointer = other.isArrayPointer;
    levels = other.levels;
    sizes = other.sizes;
}